

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O1

bool xatlas::internal::Fit::computeLeastSquaresNormal
               (Vector3 *points,uint32_t pointsCount,Vector3 *normal)

{
  ulong uVar1;
  bool bVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  Vector3 VVar17;
  Vector3 local_18;
  
  if (pointsCount < 3) {
    __assert_fail("pointsCount >= 3",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
                  ,0x66c,
                  "static bool xatlas::internal::Fit::computeLeastSquaresNormal(const Vector3 *, uint32_t, Vector3 *)"
                 );
  }
  if (pointsCount == 3) {
    fVar4 = points[2].x - points->x;
    fVar11 = points[2].y - points->y;
    fVar5 = points[2].z - points->z;
    fVar6 = points[1].x - points->x;
    fVar7 = points[1].y - points->y;
    fVar9 = points[1].z - points->z;
    local_18.z = fVar7 * fVar4 - fVar6 * fVar11;
    local_18.y = fVar5 * fVar6 - fVar9 * fVar4;
    local_18.x = fVar11 * fVar9 - fVar7 * fVar5;
    VVar17 = normalize(&local_18,fVar4);
    *normal = VVar17;
    bVar2 = true;
  }
  else {
    uVar1 = (ulong)pointsCount;
    fVar4 = 0.0;
    lVar3 = 0;
    fVar5 = 0.0;
    fVar6 = 0.0;
    do {
      fVar6 = fVar6 + *(float *)((long)&points->x + lVar3);
      fVar5 = fVar5 + *(float *)((long)&points->y + lVar3);
      fVar4 = fVar4 + *(float *)((long)&points->z + lVar3);
      lVar3 = lVar3 + 0xc;
    } while (uVar1 * 0xc != lVar3);
    fVar13 = 1.0 / (float)uVar1;
    fVar8 = 0.0;
    lVar3 = 0;
    fVar7 = 0.0;
    fVar9 = 0.0;
    fVar10 = 0.0;
    fVar11 = 0.0;
    fVar12 = 0.0;
    do {
      fVar14 = *(float *)((long)&points->x + lVar3) - fVar6 * fVar13;
      fVar15 = *(float *)((long)&points->y + lVar3) - fVar5 * fVar13;
      fVar16 = *(float *)((long)&points->z + lVar3) - fVar13 * fVar4;
      fVar8 = fVar8 + fVar14 * fVar14;
      fVar7 = fVar7 + fVar14 * fVar15;
      fVar9 = fVar9 + fVar14 * fVar16;
      fVar10 = fVar10 + fVar15 * fVar15;
      fVar11 = fVar11 + fVar15 * fVar16;
      fVar12 = fVar12 + fVar16 * fVar16;
      lVar3 = lVar3 + 0xc;
    } while (uVar1 * 0xc != lVar3);
    fVar13 = fVar10 * fVar12 - fVar11 * fVar11;
    fVar6 = fVar8 * fVar12 - fVar9 * fVar9;
    fVar5 = fVar8 * fVar10 - fVar7 * fVar7;
    fVar4 = fVar6;
    if (fVar6 <= fVar5) {
      fVar4 = fVar5;
    }
    fVar14 = fVar13;
    if (fVar13 <= fVar4) {
      fVar14 = fVar4;
    }
    if (0.0 < fVar14) {
      if ((fVar14 != fVar13) || (NAN(fVar14) || NAN(fVar13))) {
        if ((fVar14 != fVar6) || (NAN(fVar14) || NAN(fVar6))) {
          if ((fVar14 != fVar5) || (NAN(fVar14) || NAN(fVar5))) {
            fVar13 = 0.0;
            fVar6 = 0.0;
            fVar5 = 0.0;
          }
          else {
            fVar13 = fVar11 * fVar7 + fVar10 * -fVar9;
            fVar6 = fVar9 * fVar7 + fVar8 * -fVar11;
          }
        }
        else {
          fVar13 = fVar11 * fVar9 + fVar12 * -fVar7;
          fVar5 = fVar7 * fVar9 + fVar8 * -fVar11;
        }
      }
      else {
        fVar6 = fVar9 * fVar11 + fVar12 * -fVar7;
        fVar5 = fVar7 * fVar11 + fVar10 * -fVar9;
      }
      fVar4 = fVar5 * fVar5 + fVar13 * fVar13 + fVar6 * fVar6;
      if (fVar4 < 0.0) {
        fVar4 = sqrtf(fVar4);
      }
      else {
        fVar4 = SQRT(fVar4);
      }
      if (0.0001 < ABS(fVar4)) {
        fVar4 = 1.0 / fVar4;
        fVar5 = fVar5 * fVar4;
        normal->x = fVar13 * fVar4;
        normal->y = fVar6 * fVar4;
        normal->z = fVar5;
        fVar4 = fVar5 * fVar5 + normal->x * normal->x + normal->y * normal->y;
        if (fVar4 < 0.0) {
          fVar4 = sqrtf(fVar4);
        }
        else {
          fVar4 = SQRT(fVar4);
        }
        fVar5 = ABS(fVar4);
        if (fVar5 <= 1.0) {
          fVar5 = 1.0;
        }
        return ABS(fVar4 + -1.0) <= fVar5 * 0.001;
      }
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

static bool computeLeastSquaresNormal(const Vector3 *points, uint32_t pointsCount, Vector3 *normal)
	{
		XA_DEBUG_ASSERT(pointsCount >= 3);
		if (pointsCount == 3) {
			*normal = normalize(cross(points[2] - points[0], points[1] - points[0]), kEpsilon);
			return true;
		}
		const float invN = 1.0f / float(pointsCount);
		Vector3 centroid(0.0f);
		for (uint32_t i = 0; i < pointsCount; i++)
			centroid += points[i];
		centroid *= invN;
		// Calculate full 3x3 covariance matrix, excluding symmetries:
		float xx = 0.0f, xy = 0.0f, xz = 0.0f, yy = 0.0f, yz = 0.0f, zz = 0.0f;
		for (uint32_t i = 0; i < pointsCount; i++) {
			Vector3 r = points[i] - centroid;
			xx += r.x * r.x;
			xy += r.x * r.y;
			xz += r.x * r.z;
			yy += r.y * r.y;
			yz += r.y * r.z;
			zz += r.z * r.z;
		}
#if 0
		xx *= invN;
		xy *= invN;
		xz *= invN;
		yy *= invN;
		yz *= invN;
		zz *= invN;
		Vector3 weighted_dir(0.0f);
		{
			float det_x = yy * zz - yz * yz;
			const Vector3 axis_dir(det_x, xz * yz - xy * zz, xy * yz - xz * yy);
			float weight = det_x * det_x;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_y = xx * zz - xz * xz;
			const Vector3 axis_dir(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
			float weight = det_y * det_y;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		{
			float det_z = xx * yy - xy * xy;
			const Vector3 axis_dir(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
			float weight = det_z * det_z;
			if (dot(weighted_dir, axis_dir) < 0.0f)
				weight = -weight;
			weighted_dir += axis_dir * weight;
		}
		*normal = normalize(weighted_dir, kEpsilon);
#else
		const float det_x = yy * zz - yz * yz;
		const float det_y = xx * zz - xz * xz;
		const float det_z = xx * yy - xy * xy;
		const float det_max = max(det_x, max(det_y, det_z));
		if (det_max <= 0.0f)
			return false; // The points don't span a plane
		// Pick path with best conditioning:
		Vector3 dir(0.0f);
		if (det_max == det_x)
			dir = Vector3(det_x,xz * yz - xy * zz,xy * yz - xz * yy);
		else if (det_max == det_y)
			dir = Vector3(xz * yz - xy * zz, det_y, xy * xz - yz * xx);
		else if (det_max == det_z)
			dir = Vector3(xy * yz - xz * yy, xy * xz - yz * xx, det_z);
		const float len = length(dir);
		if (isZero(len, kEpsilon))
			return false;
		*normal = dir * (1.0f / len);
#endif
		return isNormalized(*normal);
	}